

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O3

ggml_tensor * ggml_rms_norm_back(ggml_context *ctx,ggml_tensor *a,ggml_tensor *b,float eps)

{
  ggml_tensor *pgVar1;
  
  pgVar1 = ggml_new_tensor_impl(ctx,a->type,4,a->ne,(ggml_tensor *)0x0,0);
  if (pgVar1 != (ggml_tensor *)0x0) {
    pgVar1->op_params[0] = (int32_t)eps;
    pgVar1->op = GGML_OP_RMS_NORM_BACK;
    pgVar1->src[0] = a;
    pgVar1->src[1] = b;
    return pgVar1;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-impl.h",
             0x70,"GGML_ASSERT(%s) failed","tensor != NULL");
}

Assistant:

struct ggml_tensor * ggml_rms_norm_back(
        struct ggml_context * ctx,
        struct ggml_tensor  * a,
        struct ggml_tensor  * b,
        float                 eps) {
    struct ggml_tensor * result = ggml_dup_tensor(ctx, a);

    ggml_set_op_params(result, &eps, sizeof(eps));

    result->op     = GGML_OP_RMS_NORM_BACK;
    result->src[0] = a;
    result->src[1] = b;

    return result;
}